

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
PreciseMeasurement_cast_Test::~PreciseMeasurement_cast_Test(PreciseMeasurement_cast_Test *this)

{
  PreciseMeasurement_cast_Test *this_local;
  
  ~PreciseMeasurement_cast_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PreciseMeasurement, cast)
{
    precise_measurement m1(2.0, precise::m);
    auto m3 = measurement_cast(m1);

    auto m4 = measurement_cast(m3);
    static_assert(
        std::is_same<decltype(m3), measurement>::value,
        "measurement cast not working for precise_measurement");
    static_assert(
        std::is_same<decltype(m4), measurement>::value,
        "measurement cast not working for measurement");
}